

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialEnergyObjectiveFunction.cpp
# Opt level: O3

DynamicVector<double,_std::allocator<double>_> * __thiscall
OpenMD::PotentialEnergyObjectiveFunction::setInitialCoords
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
          PotentialEnergyObjectiveFunction *this)

{
  int *piVar1;
  int *piVar2;
  double *pdVar3;
  double dVar4;
  pointer piVar5;
  pointer ppAVar6;
  Snapshot *pSVar7;
  double dVar8;
  int iVar9;
  Molecule *pMVar10;
  pointer ppSVar11;
  pointer ppSVar12;
  pointer ppAVar13;
  long lVar14;
  pointer pdVar15;
  int iVar16;
  StuntDouble *pSVar17;
  long lVar18;
  Atom *pAVar19;
  MoleculeIterator i;
  vector<int,_std::allocator<int>_> onProc;
  MoleculeIterator local_70;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> local_60;
  Vector3<double> local_48;
  
  piVar1 = &this->nproc_;
  MPI_Comm_size(&ompi_mpi_comm_world,piVar1);
  MPI_Comm_rank(&ompi_mpi_comm_world,&this->myrank_);
  local_48.super_Vector<double,_3U>.data_[0]._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_60,(long)this->nproc_,(value_type_conflict2 *)&local_48,
             (allocator_type *)&local_70);
  piVar5 = (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  local_48.super_Vector<double,_3U>.data_[0] =
       (double)((ulong)local_48.super_Vector<double,_3U>.data_[0]._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->displacements_,(long)*piVar1,(value_type_conflict2 *)&local_48);
  local_70._M_node = (_Base_ptr)0x0;
  this->ndf_ = 0;
  pMVar10 = SimInfo::beginMolecule(this->info_,&local_70);
  piVar2 = &this->ndf_;
  do {
    if (pMVar10 == (Molecule *)0x0) {
      if (this->hasFlucQ_ == true) {
        pMVar10 = SimInfo::beginMolecule(this->info_,&local_70);
        while (pMVar10 != (Molecule *)0x0) {
          ppAVar13 = (pMVar10->fluctuatingCharges_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar6 = (pMVar10->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if ((ppAVar13 != ppAVar6) && (*ppAVar13 != (Atom *)0x0)) {
            iVar16 = *piVar2;
            do {
              iVar16 = iVar16 + 1;
              ppAVar13 = ppAVar13 + 1;
              if (ppAVar13 == ppAVar6) break;
            } while (*ppAVar13 != (Atom *)0x0);
            *piVar2 = iVar16;
          }
          pMVar10 = SimInfo::nextMolecule(this->info_,&local_70);
        }
      }
      MPI_Allgather(piVar2);
      *piVar2 = 0;
      if (0 < (long)*piVar1) {
        lVar14 = 0;
        iVar16 = 0;
        do {
          iVar16 = iVar16 + local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar14];
          *piVar2 = iVar16;
          lVar14 = lVar14 + 1;
        } while (*piVar1 != lVar14);
      }
      piVar5 = (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      *piVar5 = 0;
      if (1 < *piVar1) {
        lVar14 = 1;
        iVar16 = 0;
        do {
          iVar16 = iVar16 + local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar14 + -1];
          piVar5[lVar14] = iVar16;
          lVar14 = lVar14 + 1;
        } while (lVar14 < *piVar1);
      }
      local_48.super_Vector<double,_3U>.data_[0] = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&__return_storage_ptr__->data_,(long)*piVar2,(value_type_conflict1 *)&local_48,
                 &local_61);
      iVar16 = (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[this->myrank_];
      pMVar10 = SimInfo::beginMolecule(this->info_,&local_70);
      while (pMVar10 != (Molecule *)0x0) {
        ppSVar12 = (pMVar10->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppSVar11 = (pMVar10->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if ((ppSVar12 != ppSVar11) && (pSVar17 = *ppSVar12, pSVar17 != (StuntDouble *)0x0)) {
          pdVar15 = (__return_storage_ptr__->data_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            ppSVar12 = ppSVar12 + 1;
            pSVar7 = pSVar17->snapshotMan_->currentSnapshot_;
            lVar18 = (long)pSVar17->localIndex_;
            lVar14 = *(long *)((long)&(pSVar7->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_)
            ;
            dVar4 = *(double *)(lVar14 + 0x10 + lVar18 * 0x18);
            pdVar3 = (double *)(lVar14 + lVar18 * 0x18);
            dVar8 = pdVar3[1];
            pdVar15[iVar16] = *pdVar3;
            (pdVar15 + iVar16)[1] = dVar8;
            pdVar15[(long)iVar16 + 2] = dVar4;
            iVar9 = iVar16 + 3;
            if (pSVar17->objType_ - otDAtom < 2) {
              SquareMatrix3<double>::toEulerAngles
                        (&local_48,
                         (SquareMatrix3<double> *)
                         (lVar18 * 0x48 +
                         *(long *)((long)&(pSVar7->atomData).aMat.
                                          super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar17->storage_)));
              pdVar15 = (__return_storage_ptr__->data_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar15[iVar16 + 3] = local_48.super_Vector<double,_3U>.data_[0];
              pdVar15[(long)iVar16 + 4] = local_48.super_Vector<double,_3U>.data_[1];
              (pdVar15 + (long)iVar16 + 4)[1] = local_48.super_Vector<double,_3U>.data_[2];
              ppSVar11 = (pMVar10->integrableObjects_).
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              iVar9 = iVar16 + 6;
            }
            iVar16 = iVar9;
          } while ((ppSVar12 != ppSVar11) && (pSVar17 = *ppSVar12, pSVar17 != (StuntDouble *)0x0));
        }
        pMVar10 = SimInfo::nextMolecule(this->info_,&local_70);
      }
      if (this->hasFlucQ_ == true) {
        pMVar10 = SimInfo::beginMolecule(this->info_,&local_70);
        while (pMVar10 != (Molecule *)0x0) {
          ppAVar13 = (pMVar10->fluctuatingCharges_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar6 = (pMVar10->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if ((ppAVar13 != ppAVar6) && (pAVar19 = *ppAVar13, pAVar19 != (Atom *)0x0)) {
            pdVar15 = (__return_storage_ptr__->data_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar16;
            do {
              iVar16 = iVar16 + 1;
              ppAVar13 = ppAVar13 + 1;
              *pdVar15 = *(double *)
                          (*(long *)((long)&(((pAVar19->super_StuntDouble).snapshotMan_)->
                                             currentSnapshot_->atomData).flucQPos.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                    (pAVar19->super_StuntDouble).storage_) +
                          (long)(pAVar19->super_StuntDouble).localIndex_ * 8);
              if (ppAVar13 == ppAVar6) break;
              pAVar19 = *ppAVar13;
              pdVar15 = pdVar15 + 1;
            } while (pAVar19 != (Atom *)0x0);
          }
          pMVar10 = SimInfo::nextMolecule(this->info_,&local_70);
        }
      }
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    ppSVar12 = (pMVar10->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppSVar11 = (pMVar10->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if ((ppSVar12 != ppSVar11) && (pSVar17 = *ppSVar12, pSVar17 != (StuntDouble *)0x0)) {
      iVar16 = *piVar2;
      do {
        ppSVar12 = ppSVar12 + 1;
        iVar16 = iVar16 + (uint)(pSVar17->objType_ - otDAtom < 2) * 3 + 3;
        if (ppSVar12 == ppSVar11) break;
        pSVar17 = *ppSVar12;
      } while (pSVar17 != (StuntDouble *)0x0);
      *piVar2 = iVar16;
    }
    pMVar10 = SimInfo::nextMolecule(this->info_,&local_70);
  } while( true );
}

Assistant:

DynamicVector<RealType> PotentialEnergyObjectiveFunction::setInitialCoords() {
#ifdef IS_MPI
    MPI_Comm_size(MPI_COMM_WORLD, &nproc_);
    MPI_Comm_rank(MPI_COMM_WORLD, &myrank_);
    std::vector<int> onProc(nproc_, 0);

    displacements_.clear();
    displacements_.resize(nproc_, 0);
#endif

    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule::AtomIterator ai;
    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;

    Vector3d pos;
    Vector3d eulerAngle;

    ndf_ = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        ndf_ += 3;

        if (sd->isDirectional()) { ndf_ += 3; }
      }
    }

    if (hasFlucQ_) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(ai); atom != NULL;
             atom = mol->nextFluctuatingCharge(ai)) {
          ndf_++;
        }
      }
    }

#ifdef IS_MPI
    MPI_Allgather(&ndf_, 1, MPI_INT, &onProc[0], 1, MPI_INT, MPI_COMM_WORLD);

    ndf_ = 0;
    for (int iproc = 0; iproc < nproc_; iproc++) {
      ndf_ += onProc[iproc];
    }

    displacements_[0] = 0;
    for (int iproc = 1; iproc < nproc_; iproc++) {
      displacements_[iproc] = displacements_[iproc - 1] + onProc[iproc - 1];
    }
#endif

    DynamicVector<RealType> xinit(ndf_, 0.0);

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        pos            = sd->getPos();
        xinit[index++] = pos[0];
        xinit[index++] = pos[1];
        xinit[index++] = pos[2];

        if (sd->isDirectional()) {
          eulerAngle     = sd->getEuler();
          xinit[index++] = eulerAngle[0];
          xinit[index++] = eulerAngle[1];
          xinit[index++] = eulerAngle[2];
        }
      }
    }

    if (hasFlucQ_) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(ai); atom != NULL;
             atom = mol->nextFluctuatingCharge(ai)) {
          xinit[index++] = atom->getFlucQPos();
        }
      }
    }

    return xinit;
  }